

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.h
# Opt level: O1

NodeRefPtr<8> __thiscall
embree::avx::GeneralBVHBuilder::
BuilderT<embree::avx::GeneralBVHBuilder::BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>,_embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>,_embree::avx::PrimInfoExtRange,_embree::PrimRef,_embree::NodeRefPtr<8>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create2,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Set2,_embree::avx::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<8>,_embree::avx::CreateLeafSpatial<8,_embree::TriangleMv<4>_>_>,_embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::avx::PrimInfoExtRange>,_embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::avx::PrimInfoExtRange>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(BuilderT<embree::avx::GeneralBVHBuilder::BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>,_embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>,_embree::avx::PrimInfoExtRange,_embree::PrimRef,_embree::NodeRefPtr<8>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create2,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Set2,_embree::avx::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<8>,_embree::avx::CreateLeafSpatial<8,_embree::TriangleMv<4>_>_>,_embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::avx::PrimInfoExtRange>,_embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::avx::PrimInfoExtRange>,_embree::Scene::BuildProgressMonitorInterface>
                  *this,BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
                        *current,CachedAllocator alloc)

{
  extended_range<unsigned_long> *range;
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  char *pcVar3;
  undefined1 auVar4 [16];
  Vec3fa VVar5;
  undefined4 uVar6;
  ThreadLocal2 *this_00;
  iterator __position;
  undefined8 uVar7;
  unsigned_long uVar8;
  size_t i;
  long lVar9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar10;
  NodeRefPtr<8> NVar11;
  size_t sVar12;
  undefined8 *puVar13;
  unsigned_long *puVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  char *pcVar19;
  ulong uVar20;
  BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
  *current_00;
  undefined1 auVar21 [32];
  NodeRefPtr<4> values [16];
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  children [16];
  ThreadLocal2 *local_838;
  ThreadLocal2 *local_830;
  ThreadLocal2 *local_828;
  bool local_820;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_818;
  undefined1 local_808 [16];
  undefined4 local_7f8;
  undefined4 uStack_7f4;
  undefined4 uStack_7f0;
  undefined4 uStack_7ec;
  undefined1 local_7e8 [16];
  undefined8 local_7d8;
  unsigned_long uStack_7d0;
  unsigned_long local_7c8;
  ThreadLocal2 *local_7a8;
  bool local_7a0 [8];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_798;
  undefined1 local_788 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_778;
  undefined1 local_768 [16];
  unsigned_long local_758;
  unsigned_long uStack_750;
  unsigned_long local_748;
  BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
  local_738 [16];
  
  if ((this->cfg).maxDepth < current->depth) {
    puVar13 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_738[0].depth = (size_t)&local_738[0].prims;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_738,"depth limit reached","");
    *puVar13 = &PTR__rtcore_error_022018b0;
    *(undefined4 *)(puVar13 + 1) = 1;
    puVar13[2] = puVar13 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar13 + 2),local_738[0].depth,
               (long)&(((CentGeomBBox3fa *)local_738[0].depth)->geomBounds).lower.field_0 +
               CONCAT71(local_738[0]._9_7_,local_738[0].alloc_barrier));
    __cxa_throw(puVar13,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  range = &(current->prims).super_extended_range<unsigned_long>;
  if ((current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end -
      (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._begin <=
      (this->cfg).maxLeafSize) {
    NVar11 = BVHBuilderBinnedFastSpatialSAH::
             CreateLeafExt<embree::NodeRefPtr<8>,embree::avx::CreateLeafSpatial<8,embree::TriangleMv<4>>>
             ::operator()((CreateLeafExt<embree::NodeRefPtr<8>,embree::avx::CreateLeafSpatial<8,embree::TriangleMv<4>>>
                           *)this->createLeaf,this->prims,&range->super_range<unsigned_long>,alloc);
    return (NodeRefPtr<8>)NVar11.ptr;
  }
  local_738[0].alloc_barrier = current->alloc_barrier;
  local_738[0].depth = current->depth;
  local_738[0].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._0_8_ =
       *(undefined8 *)&(current->prims).super_CentGeomBBox3fa.geomBounds.lower.field_0;
  local_738[0].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._8_8_ =
       *(undefined8 *)((long)&(current->prims).super_CentGeomBBox3fa.geomBounds.lower.field_0 + 8);
  local_738[0].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0._0_8_ =
       *(undefined8 *)&(current->prims).super_CentGeomBBox3fa.geomBounds.upper.field_0;
  local_738[0].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0._8_8_ =
       *(undefined8 *)((long)&(current->prims).super_CentGeomBBox3fa.geomBounds.upper.field_0 + 8);
  local_738[0].prims.super_CentGeomBBox3fa.centBounds.lower.field_0._0_8_ =
       *(undefined8 *)&(current->prims).super_CentGeomBBox3fa.centBounds.lower.field_0;
  local_738[0].prims.super_CentGeomBBox3fa.centBounds.lower.field_0._8_8_ =
       *(undefined8 *)((long)&(current->prims).super_CentGeomBBox3fa.centBounds.lower.field_0 + 8);
  local_738[0].prims.super_CentGeomBBox3fa.centBounds.upper.field_0._0_8_ =
       *(undefined8 *)&(current->prims).super_CentGeomBBox3fa.centBounds.upper.field_0;
  local_738[0].prims.super_CentGeomBBox3fa.centBounds.upper.field_0._8_8_ =
       *(undefined8 *)((long)&(current->prims).super_CentGeomBBox3fa.centBounds.upper.field_0 + 8);
  local_738[0].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._begin =
       (range->super_range<unsigned_long>)._begin;
  local_738[0].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end =
       (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end;
  local_738[0].prims.super_extended_range<unsigned_long>._ext_end =
       (current->prims).super_extended_range<unsigned_long>._ext_end;
  uVar20 = 1;
  do {
    if (uVar20 == 0) {
      uVar16 = 0xffffffffffffffff;
    }
    else {
      uVar16 = 0xffffffffffffffff;
      puVar14 = &local_738[0].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>.
                 _end;
      uVar15 = 0;
      uVar17 = 0;
      do {
        uVar18 = *puVar14 - ((range<unsigned_long> *)(puVar14 + -1))->_begin;
        if (((this->cfg).maxLeafSize < uVar18) && (uVar17 < uVar18)) {
          uVar16 = uVar15;
          uVar17 = uVar18;
        }
        uVar15 = uVar15 + 1;
        puVar14 = puVar14 + 0xe;
      } while (uVar20 != uVar15);
    }
    if (uVar16 == 0xffffffffffffffff) break;
    local_828 = (ThreadLocal2 *)(current->depth + 1);
    local_820 = false;
    local_818.m128[0] = INFINITY;
    local_818.m128[1] = INFINITY;
    local_818.m128[2] = INFINITY;
    local_818.m128[3] = INFINITY;
    local_808._8_4_ = 0xff800000;
    local_808._0_8_ = 0xff800000ff800000;
    local_808._12_4_ = 0xff800000;
    local_7f8 = 0x7f800000;
    uStack_7f4 = 0x7f800000;
    uStack_7f0 = 0x7f800000;
    uStack_7ec = 0x7f800000;
    local_7c8 = 0;
    local_7d8 = 0;
    uStack_7d0 = 0;
    local_7a0[0] = false;
    local_798.m128[0] = INFINITY;
    local_798.m128[1] = INFINITY;
    local_798.m128[2] = INFINITY;
    local_798.m128[3] = INFINITY;
    local_778.m128[0] = INFINITY;
    local_778.m128[1] = INFINITY;
    local_778.m128[2] = INFINITY;
    local_778.m128[3] = INFINITY;
    local_748 = 0;
    local_758 = 0;
    uStack_750 = 0;
    local_7e8 = local_808;
    local_7a8 = local_828;
    local_788 = local_808;
    local_768 = local_808;
    HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
    splitFallback(this->heuristic,&local_738[uVar16].prims,(PrimInfoExtRange *)&local_818.field_1,
                  (PrimInfoExtRange *)&local_798.field_1);
    lVar9 = uVar20 * 0x70;
    local_738[uVar16].alloc_barrier = local_7a0[lVar9];
    local_738[uVar16].depth = *(size_t *)(local_7a0 + lVar9 + -8);
    uVar7 = *(undefined8 *)((long)&local_798 + lVar9 + 8);
    *(undefined8 *)&local_738[uVar16].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0 =
         *(undefined8 *)(&local_798 + uVar20 * 7);
    *(undefined8 *)
     ((long)&local_738[uVar16].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0 + 8) = uVar7;
    uVar7 = *(undefined8 *)(local_788 + lVar9 + 8);
    *(undefined8 *)&local_738[uVar16].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0 =
         *(undefined8 *)(local_788 + uVar20 * 0x70);
    *(undefined8 *)
     ((long)&local_738[uVar16].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0 + 8) = uVar7;
    uVar7 = *(undefined8 *)((long)&local_778 + lVar9 + 8);
    *(undefined8 *)&local_738[uVar16].prims.super_CentGeomBBox3fa.centBounds.lower.field_0 =
         *(undefined8 *)(&local_778 + uVar20 * 7);
    *(undefined8 *)
     ((long)&local_738[uVar16].prims.super_CentGeomBBox3fa.centBounds.lower.field_0 + 8) = uVar7;
    uVar7 = *(undefined8 *)
             ((long)&local_738[uVar20 - 1].prims.super_CentGeomBBox3fa.centBounds + 0x18);
    *(undefined8 *)&local_738[uVar16].prims.super_CentGeomBBox3fa.centBounds.upper.field_0 =
         *(undefined8 *)(local_768 + uVar20 * 0x70);
    *(undefined8 *)
     ((long)&local_738[uVar16].prims.super_CentGeomBBox3fa.centBounds.upper.field_0 + 8) = uVar7;
    uVar8 = local_738[uVar20 - 1].prims.super_extended_range<unsigned_long>.
            super_range<unsigned_long>._end;
    local_738[uVar16].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._begin =
         local_738[uVar20 - 1].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>.
         _begin;
    local_738[uVar16].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end =
         uVar8;
    local_738[uVar16].prims.super_extended_range<unsigned_long>._ext_end =
         local_738[uVar20 - 1].prims.super_extended_range<unsigned_long>._ext_end;
    *(ThreadLocal2 **)(local_7a0 + lVar9 + -8) = local_828;
    local_7a0[lVar9] = local_820;
    *(ulong *)(&local_798 + uVar20 * 7) = CONCAT44(local_818.m128[1],local_818.m128[0]);
    *(ulong *)((long)&local_798 + lVar9 + 8) = CONCAT44(local_818.m128[3],local_818.m128[2]);
    *(undefined8 *)(local_788 + uVar20 * 0x70) = local_808._0_8_;
    *(undefined8 *)(local_788 + lVar9 + 8) = local_808._8_8_;
    *(ulong *)(&local_778 + uVar20 * 7) = CONCAT44(uStack_7f4,local_7f8);
    *(ulong *)((long)&local_778 + lVar9 + 8) = CONCAT44(uStack_7ec,uStack_7f0);
    *(undefined8 *)(local_768 + uVar20 * 0x70) = local_7e8._0_8_;
    *(undefined8 *)((long)&local_738[uVar20 - 1].prims.super_CentGeomBBox3fa.centBounds + 0x18) =
         local_7e8._8_8_;
    local_738[uVar20 - 1].prims.super_extended_range<unsigned_long>._ext_end = local_7c8;
    local_738[uVar20 - 1].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>.
    _begin = local_7d8;
    local_738[uVar20 - 1].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end
         = uStack_7d0;
    local_738[uVar20].alloc_barrier = local_7a0[0];
    local_738[uVar20].depth = (size_t)local_7a8;
    *(ulong *)&local_738[uVar20].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0 =
         CONCAT44(local_798.m128[1],local_798.m128[0]);
    *(ulong *)((long)&local_738[uVar20].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0 + 8) =
         CONCAT44(local_798.m128[3],local_798.m128[2]);
    *(undefined8 *)&local_738[uVar20].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0 =
         local_788._0_8_;
    *(undefined8 *)
     ((long)&local_738[uVar20].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0 + 8) =
         local_788._8_8_;
    *(ulong *)&local_738[uVar20].prims.super_CentGeomBBox3fa.centBounds.lower.field_0 =
         CONCAT44(local_778.m128[1],local_778.m128[0]);
    *(ulong *)((long)&local_738[uVar20].prims.super_CentGeomBBox3fa.centBounds.lower.field_0 + 8) =
         CONCAT44(local_778.m128[3],local_778.m128[2]);
    *(undefined8 *)&local_738[uVar20].prims.super_CentGeomBBox3fa.centBounds.upper.field_0 =
         local_768._0_8_;
    *(undefined8 *)
     ((long)&local_738[uVar20].prims.super_CentGeomBBox3fa.centBounds.upper.field_0 + 8) =
         local_768._8_8_;
    local_738[uVar20].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._begin =
         local_758;
    local_738[uVar20].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end =
         uStack_750;
    local_738[uVar20].prims.super_extended_range<unsigned_long>._ext_end = local_748;
    uVar20 = uVar20 + 1;
  } while (uVar20 < (this->cfg).branchingFactor);
  if ((this->cfg).primrefarrayalloc <
      (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end -
      (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._begin) {
    BuilderT<embree::avx::GeneralBVHBuilder::BuildRecordT<embree::avx::PrimInfoExtRange,embree::avx::Split2<embree::avx::BinSplit<32ul>,embree::avx::SpatialBinSplit<16ul>>>,embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>,embree::avx::PrimInfoExtRange,embree::PrimRef,embree::NodeRefPtr<8>,embree::FastAllocator::CachedAllocator,embree::BVHN<8>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<8>,8>::Create2,embree::AABBNode_t<embree::NodeRefPtr<8>,8>::Set2,embree::avx::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<8>,embree::avx::CreateLeafSpatial<8,embree::TriangleMv<4>>>,embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,embree::avx::PrimInfoExtRange>,embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,embree::avx::PrimInfoExtRange>,embree::Scene::BuildProgressMonitorInterface>
    ::createLargeLeaf();
  }
  local_838 = (ThreadLocal2 *)0x100;
  this_00 = (alloc.talloc0)->parent;
  if (alloc.alloc != (this_00->alloc)._M_b._M_p) {
    local_7a0[0] = true;
    local_7a8 = this_00;
    MutexSys::lock(&this_00->mutex);
    if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_00->alloc0).end + (this_00->alloc1).end) -
           ((this_00->alloc0).cur + (this_00->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar21 = ZEXT1632(ZEXT816(0) << 0x40);
    (this_00->alloc0).end = auVar21._0_8_;
    (this_00->alloc0).allocBlockSize = auVar21._8_8_;
    (this_00->alloc0).bytesUsed = auVar21._16_8_;
    (this_00->alloc0).bytesWasted = auVar21._24_8_;
    (this_00->alloc0).ptr = (char *)auVar21._0_8_;
    (this_00->alloc0).cur = auVar21._8_8_;
    (this_00->alloc0).end = auVar21._16_8_;
    (this_00->alloc0).allocBlockSize = auVar21._24_8_;
    auVar21 = ZEXT1632(ZEXT816(0) << 0x40);
    if (alloc.alloc == (FastAllocator *)0x0) {
      (this_00->alloc1).end = auVar21._0_8_;
      (this_00->alloc1).allocBlockSize = auVar21._8_8_;
      (this_00->alloc1).bytesUsed = auVar21._16_8_;
      (this_00->alloc1).bytesWasted = auVar21._24_8_;
      (this_00->alloc1).ptr = (char *)auVar21._0_8_;
      (this_00->alloc1).cur = auVar21._8_8_;
      (this_00->alloc1).end = auVar21._16_8_;
      (this_00->alloc1).allocBlockSize = auVar21._24_8_;
    }
    else {
      (this_00->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (this_00->alloc1).ptr = (char *)auVar21._0_8_;
      (this_00->alloc1).cur = auVar21._8_8_;
      (this_00->alloc1).end = auVar21._16_8_;
      (this_00->alloc1).allocBlockSize = auVar21._24_8_;
      (this_00->alloc1).end = auVar21._0_8_;
      (this_00->alloc1).allocBlockSize = auVar21._8_8_;
      (this_00->alloc1).bytesUsed = auVar21._16_8_;
      (this_00->alloc1).bytesWasted = auVar21._24_8_;
      (this_00->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (this_00->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    local_828 = (ThreadLocal2 *)&FastAllocator::s_thread_local_allocators_lock;
    local_820 = true;
    local_830 = this_00;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,__position,&local_830);
    }
    else {
      *__position._M_current = local_830;
      pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    if (local_820 == true) {
      MutexSys::unlock(&local_828->mutex);
    }
    if (local_7a0[0] == true) {
      MutexSys::unlock(&local_7a8->mutex);
    }
  }
  (alloc.talloc0)->bytesUsed = (long)&(local_838->mutex).mutex + (alloc.talloc0)->bytesUsed;
  sVar12 = (alloc.talloc0)->cur;
  uVar16 = (ulong)(-(int)sVar12 & 0x1f);
  uVar17 = (long)&(local_838->mutex).mutex + uVar16 + sVar12;
  (alloc.talloc0)->cur = uVar17;
  if ((alloc.talloc0)->end < uVar17) {
    (alloc.talloc0)->cur = sVar12;
    if ((ThreadLocal2 *)(alloc.talloc0)->allocBlockSize < (ThreadLocal2 *)((long)local_838 << 2)) {
      pcVar19 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_838);
    }
    else {
      local_828 = (ThreadLocal2 *)(alloc.talloc0)->allocBlockSize;
      pcVar19 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_828);
      (alloc.talloc0)->ptr = pcVar19;
      sVar12 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar12;
      (alloc.talloc0)->cur = 0;
      (alloc.talloc0)->end = (size_t)local_828;
      (alloc.talloc0)->cur = (size_t)local_838;
      if (local_828 < local_838) {
        (alloc.talloc0)->cur = 0;
        local_828 = (ThreadLocal2 *)(alloc.talloc0)->allocBlockSize;
        pcVar19 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_828);
        (alloc.talloc0)->ptr = pcVar19;
        sVar12 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar12;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = (size_t)local_828;
        (alloc.talloc0)->cur = (size_t)local_838;
        if (local_828 < local_838) {
          (alloc.talloc0)->cur = 0;
          pcVar19 = (char *)0x0;
          goto LAB_013bdbf6;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar12;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar16;
    pcVar19 = (alloc.talloc0)->ptr + (uVar17 - (long)local_838);
  }
LAB_013bdbf6:
  pcVar19[0xc0] = '\0';
  pcVar19[0xc1] = '\0';
  pcVar19[0xc2] = -0x80;
  pcVar19[0xc3] = '\x7f';
  pcVar19[0xc4] = '\0';
  pcVar19[0xc5] = '\0';
  pcVar19[0xc6] = -0x80;
  pcVar19[199] = '\x7f';
  pcVar19[200] = '\0';
  pcVar19[0xc9] = '\0';
  pcVar19[0xca] = -0x80;
  pcVar19[0xcb] = '\x7f';
  pcVar19[0xcc] = '\0';
  pcVar19[0xcd] = '\0';
  pcVar19[0xce] = -0x80;
  pcVar19[0xcf] = '\x7f';
  pcVar19[0xd0] = '\0';
  pcVar19[0xd1] = '\0';
  pcVar19[0xd2] = -0x80;
  pcVar19[0xd3] = '\x7f';
  pcVar19[0xd4] = '\0';
  pcVar19[0xd5] = '\0';
  pcVar19[0xd6] = -0x80;
  pcVar19[0xd7] = '\x7f';
  pcVar19[0xd8] = '\0';
  pcVar19[0xd9] = '\0';
  pcVar19[0xda] = -0x80;
  pcVar19[0xdb] = '\x7f';
  pcVar19[0xdc] = '\0';
  pcVar19[0xdd] = '\0';
  pcVar19[0xde] = -0x80;
  pcVar19[0xdf] = '\x7f';
  pcVar19[0x80] = '\0';
  pcVar19[0x81] = '\0';
  pcVar19[0x82] = -0x80;
  pcVar19[0x83] = '\x7f';
  pcVar19[0x84] = '\0';
  pcVar19[0x85] = '\0';
  pcVar19[0x86] = -0x80;
  pcVar19[0x87] = '\x7f';
  pcVar19[0x88] = '\0';
  pcVar19[0x89] = '\0';
  pcVar19[0x8a] = -0x80;
  pcVar19[0x8b] = '\x7f';
  pcVar19[0x8c] = '\0';
  pcVar19[0x8d] = '\0';
  pcVar19[0x8e] = -0x80;
  pcVar19[0x8f] = '\x7f';
  pcVar19[0x90] = '\0';
  pcVar19[0x91] = '\0';
  pcVar19[0x92] = -0x80;
  pcVar19[0x93] = '\x7f';
  pcVar19[0x94] = '\0';
  pcVar19[0x95] = '\0';
  pcVar19[0x96] = -0x80;
  pcVar19[0x97] = '\x7f';
  pcVar19[0x98] = '\0';
  pcVar19[0x99] = '\0';
  pcVar19[0x9a] = -0x80;
  pcVar19[0x9b] = '\x7f';
  pcVar19[0x9c] = '\0';
  pcVar19[0x9d] = '\0';
  pcVar19[0x9e] = -0x80;
  pcVar19[0x9f] = '\x7f';
  pcVar19[0x40] = '\0';
  pcVar19[0x41] = '\0';
  pcVar19[0x42] = -0x80;
  pcVar19[0x43] = '\x7f';
  pcVar19[0x44] = '\0';
  pcVar19[0x45] = '\0';
  pcVar19[0x46] = -0x80;
  pcVar19[0x47] = '\x7f';
  pcVar19[0x48] = '\0';
  pcVar19[0x49] = '\0';
  pcVar19[0x4a] = -0x80;
  pcVar19[0x4b] = '\x7f';
  pcVar19[0x4c] = '\0';
  pcVar19[0x4d] = '\0';
  pcVar19[0x4e] = -0x80;
  pcVar19[0x4f] = '\x7f';
  pcVar19[0x50] = '\0';
  pcVar19[0x51] = '\0';
  pcVar19[0x52] = -0x80;
  pcVar19[0x53] = '\x7f';
  pcVar19[0x54] = '\0';
  pcVar19[0x55] = '\0';
  pcVar19[0x56] = -0x80;
  pcVar19[0x57] = '\x7f';
  pcVar19[0x58] = '\0';
  pcVar19[0x59] = '\0';
  pcVar19[0x5a] = -0x80;
  pcVar19[0x5b] = '\x7f';
  pcVar19[0x5c] = '\0';
  pcVar19[0x5d] = '\0';
  pcVar19[0x5e] = -0x80;
  pcVar19[0x5f] = '\x7f';
  pcVar19[0xe0] = '\0';
  pcVar19[0xe1] = '\0';
  pcVar19[0xe2] = -0x80;
  pcVar19[0xe3] = -1;
  pcVar19[0xe4] = '\0';
  pcVar19[0xe5] = '\0';
  pcVar19[0xe6] = -0x80;
  pcVar19[0xe7] = -1;
  pcVar19[0xe8] = '\0';
  pcVar19[0xe9] = '\0';
  pcVar19[0xea] = -0x80;
  pcVar19[0xeb] = -1;
  pcVar19[0xec] = '\0';
  pcVar19[0xed] = '\0';
  pcVar19[0xee] = -0x80;
  pcVar19[0xef] = -1;
  pcVar19[0xf0] = '\0';
  pcVar19[0xf1] = '\0';
  pcVar19[0xf2] = -0x80;
  pcVar19[0xf3] = -1;
  pcVar19[0xf4] = '\0';
  pcVar19[0xf5] = '\0';
  pcVar19[0xf6] = -0x80;
  pcVar19[0xf7] = -1;
  pcVar19[0xf8] = '\0';
  pcVar19[0xf9] = '\0';
  pcVar19[0xfa] = -0x80;
  pcVar19[0xfb] = -1;
  pcVar19[0xfc] = '\0';
  pcVar19[0xfd] = '\0';
  pcVar19[0xfe] = -0x80;
  pcVar19[0xff] = -1;
  pcVar19[0xa0] = '\0';
  pcVar19[0xa1] = '\0';
  pcVar19[0xa2] = -0x80;
  pcVar19[0xa3] = -1;
  pcVar19[0xa4] = '\0';
  pcVar19[0xa5] = '\0';
  pcVar19[0xa6] = -0x80;
  pcVar19[0xa7] = -1;
  pcVar19[0xa8] = '\0';
  pcVar19[0xa9] = '\0';
  pcVar19[0xaa] = -0x80;
  pcVar19[0xab] = -1;
  pcVar19[0xac] = '\0';
  pcVar19[0xad] = '\0';
  pcVar19[0xae] = -0x80;
  pcVar19[0xaf] = -1;
  pcVar19[0xb0] = '\0';
  pcVar19[0xb1] = '\0';
  pcVar19[0xb2] = -0x80;
  pcVar19[0xb3] = -1;
  pcVar19[0xb4] = '\0';
  pcVar19[0xb5] = '\0';
  pcVar19[0xb6] = -0x80;
  pcVar19[0xb7] = -1;
  pcVar19[0xb8] = '\0';
  pcVar19[0xb9] = '\0';
  pcVar19[0xba] = -0x80;
  pcVar19[0xbb] = -1;
  pcVar19[0xbc] = '\0';
  pcVar19[0xbd] = '\0';
  pcVar19[0xbe] = -0x80;
  pcVar19[0xbf] = -1;
  pcVar19[0x60] = '\0';
  pcVar19[0x61] = '\0';
  pcVar19[0x62] = -0x80;
  pcVar19[99] = -1;
  pcVar19[100] = '\0';
  pcVar19[0x65] = '\0';
  pcVar19[0x66] = -0x80;
  pcVar19[0x67] = -1;
  pcVar19[0x68] = '\0';
  pcVar19[0x69] = '\0';
  pcVar19[0x6a] = -0x80;
  pcVar19[0x6b] = -1;
  pcVar19[0x6c] = '\0';
  pcVar19[0x6d] = '\0';
  pcVar19[0x6e] = -0x80;
  pcVar19[0x6f] = -1;
  pcVar19[0x70] = '\0';
  pcVar19[0x71] = '\0';
  pcVar19[0x72] = -0x80;
  pcVar19[0x73] = -1;
  pcVar19[0x74] = '\0';
  pcVar19[0x75] = '\0';
  pcVar19[0x76] = -0x80;
  pcVar19[0x77] = -1;
  pcVar19[0x78] = '\0';
  pcVar19[0x79] = '\0';
  pcVar19[0x7a] = -0x80;
  pcVar19[0x7b] = -1;
  pcVar19[0x7c] = '\0';
  pcVar19[0x7d] = '\0';
  pcVar19[0x7e] = -0x80;
  pcVar19[0x7f] = -1;
  lVar9 = 0;
  do {
    pcVar3 = pcVar19 + lVar9 * 8;
    pcVar3[0] = '\b';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
    pcVar3[8] = '\b';
    pcVar3[9] = '\0';
    pcVar3[10] = '\0';
    pcVar3[0xb] = '\0';
    pcVar3[0xc] = '\0';
    pcVar3[0xd] = '\0';
    pcVar3[0xe] = '\0';
    pcVar3[0xf] = '\0';
    pcVar3[0x10] = '\b';
    pcVar3[0x11] = '\0';
    pcVar3[0x12] = '\0';
    pcVar3[0x13] = '\0';
    pcVar3[0x14] = '\0';
    pcVar3[0x15] = '\0';
    pcVar3[0x16] = '\0';
    pcVar3[0x17] = '\0';
    pcVar3[0x18] = '\b';
    pcVar3[0x19] = '\0';
    pcVar3[0x1a] = '\0';
    pcVar3[0x1b] = '\0';
    pcVar3[0x1c] = '\0';
    pcVar3[0x1d] = '\0';
    pcVar3[0x1e] = '\0';
    pcVar3[0x1f] = '\0';
    lVar9 = lVar9 + 4;
  } while (lVar9 != 8);
  if (uVar20 != 0) {
    paVar10 = &local_738[0].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0;
    uVar16 = 0;
    do {
      auVar4 = *(undefined1 (*) [16])paVar10[-1].m128;
      VVar5.field_0 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)paVar10->m128;
      *(int *)(pcVar19 + uVar16 * 4 + 0x40) = auVar4._0_4_;
      uVar6 = vextractps_avx(auVar4,1);
      *(undefined4 *)(pcVar19 + uVar16 * 4 + 0x80) = uVar6;
      uVar6 = vextractps_avx(auVar4,2);
      *(undefined4 *)(pcVar19 + uVar16 * 4 + 0xc0) = uVar6;
      *(int *)(pcVar19 + uVar16 * 4 + 0x60) = VVar5.field_0._0_4_;
      uVar6 = vextractps_avx((undefined1  [16])VVar5.field_0,1);
      *(undefined4 *)(pcVar19 + uVar16 * 4 + 0xa0) = uVar6;
      uVar6 = vextractps_avx((undefined1  [16])VVar5.field_0,2);
      *(undefined4 *)(pcVar19 + uVar16 * 4 + 0xe0) = uVar6;
      uVar16 = uVar16 + 1;
      paVar10 = paVar10 + 7;
    } while (uVar20 != uVar16);
  }
  if (uVar20 != 0) {
    current_00 = local_738;
    uVar16 = 0;
    do {
      NVar11 = createLargeLeaf(this,current_00,alloc);
      (&local_828)[uVar16] = (ThreadLocal2 *)NVar11.ptr;
      uVar16 = uVar16 + 1;
      current_00 = current_00 + 1;
    } while (uVar20 != uVar16);
    uVar16 = 0;
    do {
      *(ThreadLocal2 **)(pcVar19 + uVar16 * 8) = (&local_828)[uVar16];
      uVar16 = uVar16 + 1;
    } while (uVar20 != uVar16);
  }
  return (NodeRefPtr<8>)(size_t)pcVar19;
}

Assistant:

const ReductionTy createLargeLeaf(const BuildRecord& current, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (current.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* create leaf for few primitives */
            if (current.prims.size() <= cfg.maxLeafSize && canCreateLeaf(prims,current.prims))
              return createLeaf(prims,current.prims,alloc);

            /* fill all children by always splitting the largest one */
            ReductionTy values[MAX_BRANCHING_FACTOR];
            BuildRecord children[MAX_BRANCHING_FACTOR];
            size_t numChildren = 1;
            children[0] = current;
            do {

              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<numChildren; i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].prims.size() <= cfg.maxLeafSize && canCreateLeaf(prims,children[i].prims))
                  continue;

                /* remember child with largest size */
                if (children[i].prims.size() > bestSize) {
                  bestSize = children[i].prims.size();
                  bestChild = i;
                }
              }
              if (bestChild == (size_t)-1) break;

              /*! split best child into left and right child */
              BuildRecord left(current.depth+1);
              BuildRecord right(current.depth+1);
              if (!canCreateLeaf(prims,children[bestChild].prims)) {
                canCreateLeafSplit(prims,children[bestChild].prims,left.prims,right.prims);
              } else {
                heuristic.splitFallback(children[bestChild].prims,left.prims,right.prims);
              }

              /* add new children left and right */
              children[bestChild] = children[numChildren-1];
              children[numChildren-1] = left;
              children[numChildren+0] = right;
              numChildren++;

            } while (numChildren < cfg.branchingFactor);

            /* set barrier for primrefarrayalloc */
            if (unlikely(current.size() > cfg.primrefarrayalloc))
              for (size_t i=0; i<numChildren; i++)
                children[i].alloc_barrier = children[i].size() <= cfg.primrefarrayalloc;

            /* create node */
            auto node = createNode(children,numChildren,alloc);

            /* recurse into each child  and perform reduction */
            for (size_t i=0; i<numChildren; i++)
              values[i] = createLargeLeaf(children[i],alloc);

            /* perform reduction */
            return updateNode(current,children,node,values,numChildren);
          }